

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_symbol.cpp
# Opt level: O1

void __thiscall
FunctionTable::SetTermBottomLabel(FunctionTable *this,string *func_name,string *bottom_label)

{
  int iVar1;
  pointer pFVar2;
  string *psVar3;
  bool bVar4;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  pFVar2 = (this->m_func_table).
           super__Vector_base<FunctionTableTerm,_std::allocator<FunctionTableTerm>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pFVar2 != (this->m_func_table).
                super__Vector_base<FunctionTableTerm,_std::allocator<FunctionTableTerm>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    psVar3 = (string *)&pFVar2->m_bottom_label;
    do {
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,*(long *)(psVar3 + -0x40),
                 *(long *)(psVar3 + -0x38) + *(long *)(psVar3 + -0x40));
      if (local_48 == func_name->_M_string_length) {
        if (local_48 == 0) {
          bVar4 = true;
        }
        else {
          iVar1 = bcmp(local_50,(func_name->_M_dataplus)._M_p,local_48);
          bVar4 = iVar1 == 0;
        }
      }
      else {
        bVar4 = false;
      }
      if (local_50 != local_40) {
        operator_delete(local_50);
      }
      if (bVar4) {
        std::__cxx11::string::_M_assign(psVar3);
      }
      pFVar2 = (pointer)(psVar3 + 0x48);
      psVar3 = psVar3 + 0x88;
    } while (pFVar2 != (this->m_func_table).
                       super__Vector_base<FunctionTableTerm,_std::allocator<FunctionTableTerm>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void FunctionTable::SetTermBottomLabel(const string& func_name, const string& bottom_label) {
    auto iter = m_func_table.begin();
    for (; iter != m_func_table.end(); ++iter) {
        if (iter->GetName() == func_name) {
            iter->SetBottomLabel(bottom_label);
        }
    }
}